

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall
fasttext::Model::initTableNegatives(Model *this,vector<long,_std::allocator<long>_> *counts)

{
  iterator __position;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer plVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 extraout_var [56];
  undefined1 auVar9 [64];
  float fVar10;
  undefined1 auVar11 [64];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  float local_3c;
  int local_34;
  undefined1 extraout_var_00 [56];
  
  plVar3 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish == plVar3) {
    local_3c = 0.0;
  }
  else {
    local_3c = 0.0;
    uVar5 = 0;
    auVar11 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    do {
      auVar6._0_8_ = (double)plVar3[uVar5];
      auVar6._8_8_ = in_XMM4_Qb;
      if (auVar6._0_8_ < 0.0) {
        auVar11._0_8_ = sqrt(auVar6._0_8_);
        auVar11._8_56_ = extraout_var;
        auVar6 = auVar11._0_16_;
        auVar11 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      }
      else {
        auVar6 = vsqrtsd_avx(auVar6,auVar6);
      }
      auVar6 = vandpd_avx(auVar6,auVar11._0_16_);
      local_3c = (float)(auVar6._0_8_ + (double)local_3c);
      uVar5 = uVar5 + 1;
      plVar3 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl
                                   .super__Vector_impl_data._M_finish - (long)plVar3 >> 3));
  }
  plVar3 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish != plVar3) {
    uVar5 = 0;
    do {
      auVar7._0_8_ = (double)plVar3[uVar5];
      auVar7._8_8_ = in_XMM4_Qb;
      if (auVar7._0_8_ < 0.0) {
        auVar9._0_8_ = sqrt(auVar7._0_8_);
        auVar9._8_56_ = extraout_var_00;
        auVar6 = auVar9._0_16_;
      }
      else {
        auVar6 = vsqrtsd_avx(auVar7,auVar7);
      }
      auVar8._0_4_ = (float)auVar6._0_8_;
      auVar8._4_12_ = auVar6._4_12_;
      auVar1._8_4_ = 0x7fffffff;
      auVar1._0_8_ = 0x7fffffff7fffffff;
      auVar1._12_4_ = 0x7fffffff;
      auVar6 = vandps_avx512vl(auVar8,auVar1);
      fVar10 = (auVar6._0_4_ * 1e+07) / local_3c;
      if (0.0 < fVar10) {
        lVar4 = 1;
        do {
          local_34 = (int)uVar5;
          __position._M_current =
               (this->negatives).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->negatives).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&this->negatives,__position,&local_34);
          }
          else {
            *__position._M_current = local_34;
            (this->negatives).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          auVar2._8_8_ = in_XMM4_Qb;
          auVar2._0_8_ = in_XMM4_Qa;
          auVar6 = vcvtusi2ss_avx512f(auVar2,lVar4);
          lVar4 = lVar4 + 1;
        } while (auVar6._0_4_ < fVar10);
      }
      uVar5 = uVar5 + 1;
      plVar3 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl
                                   .super__Vector_impl_data._M_finish - (long)plVar3 >> 3));
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>&>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (this->negatives).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (this->negatives).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,&this->rng);
  return;
}

Assistant:

void Model::initTableNegatives(const std::vector<int64_t>& counts) {
  real z = 0.0;
  for (size_t i = 0; i < counts.size(); i++) {
    z += pow(counts[i], 0.5);
  }
  for (size_t i = 0; i < counts.size(); i++) {
    real c = pow(counts[i], 0.5);
    for (size_t j = 0; j < c * NEGATIVE_TABLE_SIZE / z; j++) {
      negatives.push_back(i);
    }
  }
  std::shuffle(negatives.begin(), negatives.end(), rng);
}